

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::set_oauth_token(YdiskRestClient *this,char *token)

{
  string header_token;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (token != (char *)0x0) {
    this->token = token;
    std::__cxx11::string::string((string *)&header_token,"OAuth ",(allocator *)&local_58);
    std::__cxx11::string::append((char *)&header_token);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_58,(char (*) [14])"Authorization",&header_token);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_assign_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->headers,&local_58,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stack0xffffffffffffffe8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_58);
    std::__cxx11::string::~string((string *)&header_token);
    return;
  }
  __assert_fail("token != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/restclient.cpp"
                ,0x79,"void YdiskRestClient::set_oauth_token(const char *)");
}

Assistant:

void YdiskRestClient::set_oauth_token(const char *token)
{
    assert(token != NULL);
    this->token = token;

    std::string header_token = "OAuth ";
    header_token += token;
    headers = { {"Authorization", header_token} };
}